

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t *
extents_fit_alignment(extents_t *extents,size_t min_size,size_t max_size,size_t alignment)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  extent_t *extent_00;
  bitmap_t *pbVar4;
  bitmap_t *bitmap;
  long in_RCX;
  ulong in_RSI;
  size_t leadsize;
  uintptr_t next_align;
  size_t candidate_size;
  uintptr_t base;
  extent_t *extent;
  pszind_t i;
  pszind_t pind_max;
  pszind_t pind;
  pszind_t ind_1;
  pszind_t mod_1;
  size_t delta_inverse_mask_1;
  pszind_t lg_delta_1;
  pszind_t grp_1;
  pszind_t shift_1;
  pszind_t x_1;
  pszind_t ind;
  pszind_t mod;
  size_t delta_inverse_mask;
  pszind_t lg_delta;
  pszind_t grp;
  pszind_t shift;
  pszind_t x;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  bitmap_info_t *in_stack_ffffffffffffff40;
  bitmap_t *in_stack_ffffffffffffff48;
  uint local_94;
  extent_heap_t *in_stack_ffffffffffffff98;
  uint local_34;
  
  sVar3 = extent_size_quantize_ceil(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (sVar3 < 0x7000000000000001) {
    uVar2 = lg_floor(sVar3 * 2 - 1);
    if (uVar2 < 0xe) {
      in_stack_ffffffffffffff3c = 0;
    }
    else {
      in_stack_ffffffffffffff3c = uVar2 - 0xe;
    }
    if (uVar2 < 0xf) {
      in_stack_ffffffffffffff38 = 0xc;
    }
    else {
      in_stack_ffffffffffffff38 = uVar2 - 3;
    }
  }
  sVar3 = extent_size_quantize_ceil(CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  if (sVar3 < 0x7000000000000001) {
    uVar2 = lg_floor(sVar3 * 2 - 1);
    if (uVar2 < 0xe) {
      iVar5 = 0;
    }
    else {
      iVar5 = uVar2 - 0xe;
    }
    if (uVar2 < 0xf) {
      bVar1 = 0xc;
    }
    else {
      bVar1 = (char)uVar2 - 3;
    }
    local_34 = iVar5 * 4 + ((uint)((sVar3 - 1 & -1L << (bVar1 & 0x3f)) >> (bVar1 & 0x3f)) & 3);
  }
  else {
    local_34 = 199;
  }
  sVar3 = bitmap_ffu(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                     CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_94 = (uint)sVar3;
  while( true ) {
    if (local_34 <= local_94) {
      return (extent_t *)0x0;
    }
    extent_00 = extent_heap_first(in_stack_ffffffffffffff98);
    pbVar4 = (bitmap_t *)extent_base_get(extent_00);
    sVar3 = extent_size_get(extent_00);
    bitmap = (bitmap_t *)
             ((long)pbVar4 + ((in_RCX + 0xfffU & 0xfffffffffffff000) - 1) &
             (in_RCX + 0xfffU & 0xfffffffffffff000 ^ 0xffffffffffffffff) + 1);
    if (((pbVar4 <= bitmap) && (bitmap < (bitmap_t *)((long)pbVar4 + sVar3))) &&
       (in_stack_ffffffffffffff40 = (bitmap_info_t *)((long)bitmap - (long)pbVar4),
       in_RSI <= sVar3 - (long)in_stack_ffffffffffffff40)) break;
    sVar3 = bitmap_ffu(bitmap,in_stack_ffffffffffffff40,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_94 = (uint)sVar3;
  }
  return extent_00;
}

Assistant:

static extent_t *
extents_fit_alignment(extents_t *extents, size_t min_size, size_t max_size,
    size_t alignment) {
        pszind_t pind = sz_psz2ind(extent_size_quantize_ceil(min_size));
        pszind_t pind_max = sz_psz2ind(extent_size_quantize_ceil(max_size));

	for (pszind_t i = (pszind_t)bitmap_ffu(extents->bitmap,
	    &extents_bitmap_info, (size_t)pind); i < pind_max; i =
	    (pszind_t)bitmap_ffu(extents->bitmap, &extents_bitmap_info,
	    (size_t)i+1)) {
		assert(i < SC_NPSIZES);
		assert(!extent_heap_empty(&extents->heaps[i]));
		extent_t *extent = extent_heap_first(&extents->heaps[i]);
		uintptr_t base = (uintptr_t)extent_base_get(extent);
		size_t candidate_size = extent_size_get(extent);
		assert(candidate_size >= min_size);

		uintptr_t next_align = ALIGNMENT_CEILING((uintptr_t)base,
		    PAGE_CEILING(alignment));
		if (base > next_align || base + candidate_size <= next_align) {
			/* Overflow or not crossing the next alignment. */
			continue;
		}

		size_t leadsize = next_align - base;
		if (candidate_size - leadsize >= min_size) {
			return extent;
		}
	}

	return NULL;
}